

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-test.c++
# Opt level: O0

size_t __thiscall
kj::anon_unknown_0::MockInputStream::tryRead
          (MockInputStream *this,ArrayPtr<unsigned_char> buffer,size_t minBytes)

{
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> start;
  uchar *__dest;
  uchar *__src;
  size_t end;
  ArrayPtr<const_unsigned_char> AVar1;
  uchar *local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> local_30;
  size_t n;
  size_t minBytes_local;
  MockInputStream *this_local;
  ArrayPtr<unsigned_char> buffer_local;
  
  buffer_local.ptr = (uchar *)buffer.size_;
  this_local = (MockInputStream *)buffer.ptr;
  n = minBytes;
  minBytes_local = (size_t)this;
  local_38 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
  local_30 = min<unsigned_long&,unsigned_long>(&this->blockSize,&local_38);
  local_30 = max<unsigned_long&,unsigned_long&>(&local_30,&n);
  local_40 = ArrayPtr<const_unsigned_char>::size(&this->bytes);
  local_30 = min<unsigned_long&,unsigned_long>(&local_30,&local_40);
  __dest = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
  __src = ArrayPtr<const_unsigned_char>::begin(&this->bytes);
  memcpy(__dest,__src,local_30);
  start = local_30;
  end = ArrayPtr<const_unsigned_char>::size(&this->bytes);
  AVar1 = ArrayPtr<const_unsigned_char>::slice(&this->bytes,start,end);
  local_50 = AVar1.ptr;
  (this->bytes).ptr = local_50;
  local_48 = AVar1.size_;
  (this->bytes).size_ = local_48;
  return local_30;
}

Assistant:

size_t tryRead(ArrayPtr<byte> buffer, size_t minBytes) override {
    // Clamp max read to blockSize.
    size_t n = kj::min(blockSize, buffer.size());

    // Unless that's less than minBytes -- in which case, use minBytes.
    n = kj::max(n, minBytes);

    // But also don't read more data than we have.
    n = kj::min(n, bytes.size());

    memcpy(buffer.begin(), bytes.begin(), n);
    bytes = bytes.slice(n, bytes.size());
    return n;
  }